

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O2

int spng_set_chrm_int(spng_ctx *ctx,spng_chrm_int *chrm_int)

{
  ulong uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int iVar9;
  
  if (chrm_int != (spng_chrm_int *)0x0 && ctx != (spng_ctx *)0x0) {
    if ((ctx->data == (uchar *)0x0) && ((ctx->field_0xcc & 0x10) == 0)) {
      iVar9 = 0x52;
    }
    else {
      iVar9 = read_chunks(ctx,0);
      if (iVar9 == 0) {
        iVar9 = check_chrm_int(chrm_int);
        if (iVar9 == 0) {
          uVar5 = chrm_int->white_point_x;
          uVar6 = chrm_int->white_point_y;
          uVar7 = chrm_int->red_x;
          uVar8 = chrm_int->red_y;
          uVar2 = chrm_int->green_y;
          uVar3 = chrm_int->blue_x;
          uVar4 = chrm_int->blue_y;
          (ctx->chrm_int).green_x = chrm_int->green_x;
          (ctx->chrm_int).green_y = uVar2;
          (ctx->chrm_int).blue_x = uVar3;
          (ctx->chrm_int).blue_y = uVar4;
          (ctx->chrm_int).white_point_x = uVar5;
          (ctx->chrm_int).white_point_y = uVar6;
          (ctx->chrm_int).red_x = uVar7;
          (ctx->chrm_int).red_y = uVar8;
          uVar1._0_4_ = ctx->user;
          uVar1._4_4_ = ctx->stored;
          ctx->user = (spng_chunk_bitfield)(int)(uVar1 | 0x400000004);
          ctx->stored = (spng_chunk_bitfield)(int)((uVar1 | 0x400000004) >> 0x20);
          iVar9 = 0;
        }
        else {
          iVar9 = 0x22;
        }
      }
    }
    return iVar9;
  }
  return 1;
}

Assistant:

int spng_set_chrm_int(spng_ctx *ctx, struct spng_chrm_int *chrm_int)
{
    SPNG_SET_CHUNK_BOILERPLATE(chrm_int);

    if(check_chrm_int(chrm_int)) return SPNG_ECHRM;

    ctx->chrm_int = *chrm_int;

    ctx->stored.chrm = 1;
    ctx->user.chrm = 1;

    return 0;
}